

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O2

void __thiscall MeshLib::SolidDelegate::removeFace(SolidDelegate *this,Solid *pS,Face *f)

{
  Node<MeshLib::Edge> *pNVar1;
  Edge *e;
  SolidEdgeIterator *pSVar2;
  int iVar3;
  SolidEdgeIterator *pSVar4;
  bool bVar5;
  SolidEdgeIterator eiter;
  
  pSVar4 = (SolidEdgeIterator *)f->m_halfedge;
  iVar3 = 0;
  do {
    if (iVar3 == 3) {
      iVar3 = 3;
      while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
        e = (Edge *)pSVar4->m_solid;
        pSVar2 = (SolidEdgeIterator *)(pSVar4->m_iter).m_stack[1];
        if (e->m_halfedge[1] == (HalfEdge *)0x0) {
          removeEdge(this,pS,e);
          std::__cxx11::string::~string((string *)&e->m_string);
          operator_delete(e);
          std::__cxx11::string::~string((string *)((pSVar4->m_iter).m_stack + 2));
          operator_delete(pSVar4);
          this = (SolidDelegate *)pSVar4;
          pSVar4 = pSVar2;
        }
        else {
          if ((SolidEdgeIterator *)e->m_halfedge[0] == pSVar4) {
            e->m_halfedge[0] = e->m_halfedge[1];
          }
          std::__cxx11::string::~string((string *)((pSVar4->m_iter).m_stack + 2));
          operator_delete(pSVar4);
          e->m_halfedge[1] = (HalfEdge *)0x0;
          this = (SolidDelegate *)pSVar4;
          pSVar4 = pSVar2;
        }
      }
      AVL::Tree<MeshLib::Face>::remove(&pS->m_faces,(char *)f);
      return;
    }
    pSVar4 = (SolidEdgeIterator *)(pSVar4->m_iter).m_stack[1];
    pNVar1 = (pSVar4->m_iter).m_pointer;
    pSVar2 = *(SolidEdgeIterator **)&pNVar1[2].height;
    if (pSVar2 == pSVar4) {
      this = (SolidDelegate *)&eiter;
      SolidEdgeIterator::SolidEdgeIterator(&eiter,pS);
      while (eiter.m_iter.m_finished == false) {
        pSVar2 = (SolidEdgeIterator *)(eiter.m_iter.m_pointer)->data->m_halfedge[0];
        if (((pSVar2 != pSVar4) && ((pSVar2->m_iter).m_pointer == pNVar1)) ||
           ((pSVar2 = (SolidEdgeIterator *)(eiter.m_iter.m_pointer)->data->m_halfedge[1],
            pSVar2 != (SolidEdgeIterator *)0x0 &&
            ((pSVar2 != pSVar4 && ((pSVar2->m_iter).m_pointer == pNVar1)))))) {
          *(SolidEdgeIterator **)&pNVar1[2].height = pSVar2;
          break;
        }
        this = (SolidDelegate *)&eiter.m_iter;
        AVL::TreeIterator<MeshLib::Edge>::operator++(&eiter.m_iter);
      }
      pSVar2 = *(SolidEdgeIterator **)&pNVar1[2].height;
    }
    if (pSVar2 == pSVar4) {
      *(undefined8 *)&pNVar1[2].height = 0;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void SolidDelegate::removeFace (Solid * pS, Face * f) 
{
	int i;
	HalfEdge * he = f->halfedge ();
	for(i=0; i<3; i++)
	{
		he = he->he_next ();
		Vertex * v = he->target ();
		if(v->halfedge () == he)
		{
			for(SolidEdgeIterator eiter(pS); !eiter.end (); ++eiter)
			{
				Edge * e = *eiter;
				HalfEdge * hhe = e->halfedge (0);
				if(hhe->target () == v && hhe != he)
				{
					v->halfedge () = hhe;
					break;
				}
				else if (e->halfedge (1) != NULL && e->halfedge (1)->target () == v && e->halfedge (1) != he)
				{
					v->halfedge () = e->halfedge (1);
					break;
				}
			}
		}
		if(v->halfedge () == he)
			v->halfedge () = NULL;
	}
	for(i=0; i<3; i++)
	{
		HalfEdge * nhe = he->he_next ();
	//	Vertex * v = he->target ();
		Edge * e = he->edge ();
		if(e->halfedge (1) == NULL)
		{
			removeEdge(pS, e);
			delete e;
			delete he;
		}
		else
		{
			if(e->halfedge (0) == he)
				e->halfedge (0) = e->halfedge (1);
			delete he;
			e->halfedge(1) = NULL;
		}
		he = nhe;
	}

	pS->m_faces.remove(f);
}